

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTPNList::gen_code(CTPNList *this,int discard,int for_condition)

{
  uint uVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t in_RCX;
  size_t __n;
  undefined4 in_register_00000014;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  CTPNList *pCVar5;
  
  iVar4 = (*(this->super_CTPNListBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[1]
          )(this,CONCAT44(in_register_00000034,discard),CONCAT44(in_register_00000014,for_condition)
           );
  pCVar5 = this;
  if (CONCAT44(extraout_var,iVar4) == 0) {
    while (pCVar5 = (CTPNList *)(pCVar5->super_CTPNListBase).tail_, pCVar5 != (CTPNList *)0x0) {
      (**(pCVar5->super_CTPNListBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
                (pCVar5,0,0);
    }
    if ((this->super_CTPNListBase).cnt_ < 0x100) {
      CTcGenTarg::write_op(G_cg,0xc0);
      CTcDataStream::write
                (&G_cs->super_CTcDataStream,(int)(char)(this->super_CTPNListBase).cnt_,__buf,in_RCX)
      ;
      CTcDataStream::write
                (&G_cs->super_CTcDataStream,(int)(char)G_cg->predef_meta_idx_[1],__buf_00,in_RCX);
    }
    else {
      CTcGenTarg::write_op(G_cg,0xc1);
      CTcDataStream::write2(&G_cs->super_CTcDataStream,(this->super_CTPNListBase).cnt_);
      CTcDataStream::write2(&G_cs->super_CTcDataStream,G_cg->predef_meta_idx_[1]);
    }
    pCVar3 = G_cg;
    G_cg->sp_depth_ = G_cg->sp_depth_ - (this->super_CTPNListBase).cnt_;
    if (discard != 0) {
      return;
    }
    CTcGenTarg::write_op(pCVar3,0x8b);
  }
  else {
    if (discard != 0) {
      return;
    }
    CTcGenTarg::write_op(G_cg,'\x06');
    CTcGenTarg::add_const_list
              (G_cg,this,&G_cs->super_CTcDataStream,(G_cs->super_CTcDataStream).ofs_);
    CTcDataStream::write4(&G_cs->super_CTcDataStream,0);
  }
  pCVar3 = G_cg;
  uVar1 = G_cg->sp_depth_;
  __n = (size_t)uVar1;
  G_cg->sp_depth_ = uVar1 + 1;
  if (pCVar3->max_sp_depth_ <= (int)uVar1) {
    pCVar3->max_sp_depth_ = uVar1 + 1;
  }
  if (((this->super_CTPNListBase).field_0x48 & 2) != 0) {
    CTcGenTarg::write_op(pCVar3,0xc0);
    CTcDataStream::write(&G_cs->super_CTcDataStream,1,__buf_01,__n);
    CTcDataStream::write
              (&G_cs->super_CTcDataStream,(int)(char)G_cg->predef_meta_idx_[7],__buf_02,__n);
    pCVar3 = G_cg;
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
    CTcGenTarg::write_op(pCVar3,0x8b);
    pCVar3 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar4 = iVar2 + 1;
    G_cg->sp_depth_ = iVar4;
    if (pCVar3->max_sp_depth_ <= iVar2) {
      pCVar3->max_sp_depth_ = iVar4;
    }
  }
  return;
}

Assistant:

void CTPNList::gen_code(int discard, int for_condition)
{
    /*
     *   Before we construct the list dynamically, check to see if the
     *   list is constant.  If it is, we need only built the list in the
     *   constant pool, and push its offset.  
     */
    if (is_const())
    {
        /* push the value only if we're not discarding it */
        if (!discard)
        {
            /* write the instruction */
            G_cg->write_op(OPC_PUSHLST);

            /* add the list to the constant pool */
            G_cg->add_const_list(this, G_cs, G_cs->get_ofs());

            /* 
             *   write a placeholder address, which will be corrected by
             *   the fixup that add_const_list() created 
             */
            G_cs->write4(0);

            /* note the push */
            G_cg->note_push();
        }
    }
    else
    {
        /*
         *   It's not a constant list, so we must generate code to construct
         *   a list dynamically.  Push each element of the list.  We need
         *   each value (hence discard = false), and we require the
         *   assignable value of each expression (hence for_condition =
         *   false).  Push the argument list in reverse order, since the
         *   run-time metaclass requires this ordering.  
         */
        for (CTPNListEle *ele = get_tail() ; ele != 0 ; ele = ele->get_prev())
            ele->gen_code(FALSE, FALSE);

        /* generate a NEW instruction for an object of metaclass LIST */
        if (get_count() <= 255)
        {
            /* the count will fit in one byte - use the short form */
            G_cg->write_op(OPC_NEW1);
            G_cs->write((char)get_count());
            G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
        }
        else
        {
            /* count doesn't fit in one byte - use the long form */
            G_cg->write_op(OPC_NEW2);
            G_cs->write2(get_count());
            G_cs->write2(G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
        }
        
        /* new1/new2 remove arguments */
        G_cg->note_pop(get_count());

        /* if we're not discarding the value, push it */
        if (!discard)
        {
            G_cg->write_op(OPC_GETR0);
            G_cg->note_push();
        }
    }

    /*
     *   If this is a lookup table list, and we're not discarding the value,
     *   create the actual LookupTable object from the list source.  If we're
     *   discarding the value there's no need to create the object, since
     *   doing so will have no meaningful side effects.  
     */
    if (!discard && is_lookup_table_)
    {
        /* 
         *   To construct the lookup table, we simply pass the list of [key,
         *   value, key, value...] elements to the LookupTable constructor.
         *   The list is already on the stack, so simply call the constructor
         *   with one argument.  
         */
        G_cg->write_op(OPC_NEW1);
        G_cs->write(1);
        G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LOOKUP_TABLE));

        /* NEW1 removes arguments */
        G_cg->note_pop(1);

        /* push the result */
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}